

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,string *linkLibs,string *flags,string *linkFlags,
          string *frameworkPath,string *linkPath,cmGeneratorTarget *target,bool useWatcomQuote)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *pppcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmMakefile *pcVar5;
  char *pcVar6;
  cmSourceFile *this_00;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  char *pcVar11;
  long *plVar12;
  char *__s;
  string *psVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  pointer ppcVar16;
  undefined8 uVar17;
  ulong uVar18;
  byte bVar19;
  char *__end;
  string linkLanguage;
  string sFlagVar;
  string buildType;
  string local_a8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  pcVar5 = this->Makefile;
  linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"CMAKE_BUILD_TYPE","");
  pcVar11 = cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
  std::__cxx11::string::string((string *)&buildType,pcVar11,(allocator *)&sFlagVar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::UpperCase(&linkLanguage,&buildType);
  std::__cxx11::string::operator=((string *)&buildType,(string *)&linkLanguage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
    operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
  }
  iVar10 = cmGeneratorTarget::GetType(target);
  switch(iVar10) {
  case 0:
    pcVar5 = this->Makefile;
    linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&linkLanguage,"CMAKE_EXE_LINKER_FLAGS","");
    cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
    std::__cxx11::string::append((char *)linkFlags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (buildType._M_string_length != 0) {
      linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&linkLanguage,"CMAKE_EXE_LINKER_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&linkLanguage,(ulong)buildType._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(this->Makefile,&linkLanguage);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
    }
    cmTarget::GetLinkerLanguage(&linkLanguage,target->Target,&buildType);
    if (linkLanguage._M_string_length == 0) {
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",
                 (target->Target->Name)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    }
    else {
      AddLanguageFlags(this,flags,&linkLanguage,&buildType);
      OutputLinkLibraries(this,linkLibs,frameworkPath,linkPath,target,false,false,useWatcomQuote);
      pcVar5 = this->Makefile;
      paVar2 = &sFlagVar.field_2;
      sFlagVar._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"BUILD_SHARED_LIBS","");
      pcVar11 = cmMakefile::GetDefinition(pcVar5,&sFlagVar);
      bVar7 = cmSystemTools::IsOn(pcVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar2) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        pppcVar3 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pppcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"CMAKE_SHARED_BUILD_","")
        ;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&sources,(ulong)linkLanguage._M_dataplus._M_p);
        paVar4 = &local_a8.field_2;
        puVar15 = (ulong *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_a8.field_2._M_allocated_capacity = *puVar15;
          local_a8.field_2._8_4_ = (undefined4)plVar12[3];
          local_a8.field_2._12_4_ = *(undefined4 *)((long)plVar12 + 0x1c);
          local_a8._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *puVar15;
          local_a8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_a8._M_string_length = plVar12[1];
        *plVar12 = (long)puVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_FLAGS","");
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar4) {
          uVar17 = local_a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_48 + local_a8._M_string_length) {
          uVar18 = 0xf;
          if (local_50 != local_40) {
            uVar18 = local_40[0];
          }
          if (uVar18 < local_48 + local_a8._M_string_length) goto LAB_00252669;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_50,0,(char *)0x0,(ulong)local_a8._M_dataplus._M_p);
        }
        else {
LAB_00252669:
          puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_50)
          ;
        }
        psVar1 = puVar14 + 2;
        if ((size_type *)*puVar14 == psVar1) {
          sFlagVar.field_2._M_allocated_capacity = *psVar1;
          sFlagVar.field_2._8_8_ = puVar14[3];
          sFlagVar._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          sFlagVar.field_2._M_allocated_capacity = *psVar1;
          sFlagVar._M_dataplus._M_p = (pointer)*puVar14;
        }
        sFlagVar._M_string_length = puVar14[1];
        *puVar14 = psVar1;
        puVar14[1] = 0;
        *(char *)psVar1 = '\0';
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar4) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar3) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        cmMakefile::GetSafeDefinition(this->Makefile,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sFlagVar._M_dataplus._M_p != paVar2) {
          operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
        }
      }
      sFlagVar._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"WIN32_EXECUTABLE","");
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(target,&sFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar2) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = this->Makefile;
      if (bVar7) {
        sFlagVar._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sFlagVar,"CMAKE_CREATE_WIN32_EXE","");
        cmMakefile::GetSafeDefinition(pcVar5,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
      }
      else {
        sFlagVar._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sFlagVar,"CMAKE_CREATE_CONSOLE_EXE","");
        cmMakefile::GetSafeDefinition(pcVar5,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar2) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)linkFlags);
      bVar7 = cmTarget::IsExecutableWithExports(target->Target);
      if (bVar7) {
        sFlagVar._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"CMAKE_EXE_EXPORTS_","")
        ;
        std::__cxx11::string::_M_append((char *)&sFlagVar,(ulong)linkLanguage._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&sFlagVar);
        cmMakefile::GetSafeDefinition(this->Makefile,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sFlagVar._M_dataplus._M_p != paVar2) {
          operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
        }
      }
      sFlagVar._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"LINK_FLAGS","");
      pcVar11 = cmGeneratorTarget::GetProperty(target,&sFlagVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sFlagVar._M_dataplus._M_p != paVar2) {
        operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
      }
      if (pcVar11 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if (buildType._M_string_length != 0) {
        sFlagVar._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"LINK_FLAGS_","");
        std::__cxx11::string::_M_append((char *)&sFlagVar,(ulong)buildType._M_dataplus._M_p);
        pcVar11 = cmGeneratorTarget::GetProperty(target,&sFlagVar);
        if (pcVar11 != (char *)0x0) {
          std::__cxx11::string::append((char *)linkFlags);
          std::__cxx11::string::append((char *)linkFlags);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sFlagVar._M_dataplus._M_p != paVar2) {
          operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    break;
  case 1:
    GetStaticLibraryFlags(this,linkFlags,&buildType,target->Target);
    break;
  case 2:
    pcVar11 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_002520b5;
  case 3:
    pcVar11 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_002520b5:
    pcVar5 = this->Makefile;
    linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,pcVar11,pcVar11 + 0x19);
    __s = cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
    pcVar6 = (char *)linkFlags->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)linkFlags,0,pcVar6,(ulong)__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (buildType._M_string_length != 0) {
      linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&linkLanguage,pcVar11,pcVar11 + 0x19);
      std::__cxx11::string::append((char *)&linkLanguage);
      std::__cxx11::string::_M_append((char *)&linkLanguage,(ulong)buildType._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(this->Makefile,&linkLanguage);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
    }
    pcVar5 = this->Makefile;
    linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"WIN32","");
    bVar7 = cmMakefile::IsOn(pcVar5,&linkLanguage);
    if (bVar7) {
      pcVar5 = this->Makefile;
      sFlagVar._M_dataplus._M_p = (pointer)&sFlagVar.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sFlagVar,"CYGWIN","");
      bVar8 = cmMakefile::IsOn(pcVar5,&sFlagVar);
      bVar9 = true;
      if (!bVar8) {
        pcVar5 = this->Makefile;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MINGW","");
        bVar9 = cmMakefile::IsOn(pcVar5,&local_a8);
      }
      bVar8 = !bVar8;
      bVar19 = bVar9 ^ 1;
    }
    else {
      bVar8 = false;
      bVar19 = 0;
    }
    if ((bVar8) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar7) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sFlagVar._M_dataplus._M_p != &sFlagVar.field_2)) {
      operator_delete(sFlagVar._M_dataplus._M_p,sFlagVar.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    if (bVar19 != 0) {
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&sources,&buildType);
      if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ppcVar16 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          this_00 = *ppcVar16;
          psVar13 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
          iVar10 = std::__cxx11::string::compare((char *)psVar13);
          if (iVar10 == 0) {
            pcVar5 = this->Makefile;
            linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&linkLanguage,"CMAKE_LINK_DEF_FILE_FLAG","");
            cmMakefile::GetSafeDefinition(pcVar5,&linkLanguage);
            std::__cxx11::string::append((char *)linkFlags);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
              operator_delete(linkLanguage._M_dataplus._M_p,
                              linkLanguage.field_2._M_allocated_capacity + 1);
            }
            psVar13 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
            cmOutputConverter::Convert
                      (&linkLanguage,&this->super_cmOutputConverter,psVar13,FULL,SHELL);
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)linkLanguage._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
              operator_delete(linkLanguage._M_dataplus._M_p,
                              linkLanguage.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)linkFlags);
          }
          ppcVar16 = ppcVar16 + 1;
        } while (ppcVar16 !=
                 sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)sources.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)sources.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"LINK_FLAGS","");
    pcVar11 = cmGeneratorTarget::GetProperty(target,&linkLanguage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
      operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1);
    }
    if (pcVar11 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (buildType._M_string_length != 0) {
      linkLanguage._M_dataplus._M_p = (pointer)&linkLanguage.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLanguage,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&linkLanguage,(ulong)buildType._M_dataplus._M_p);
      pcVar11 = cmGeneratorTarget::GetProperty(target,&linkLanguage);
      if (pcVar11 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkLanguage._M_dataplus._M_p != &linkLanguage.field_2) {
        operator_delete(linkLanguage._M_dataplus._M_p,linkLanguage.field_2._M_allocated_capacity + 1
                       );
      }
    }
    OutputLinkLibraries(this,linkLibs,frameworkPath,linkPath,target,false,false,useWatcomQuote);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buildType._M_dataplus._M_p != &buildType.field_2) {
    operator_delete(buildType._M_dataplus._M_p,buildType.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(std::string& linkLibs,
                                 std::string& flags,
                                 std::string& linkFlags,
                                 std::string& frameworkPath,
                                 std::string& linkPath,
                                 cmGeneratorTarget* target,
                                 bool useWatcomQuote)
{
  std::string buildType =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  buildType = cmSystemTools::UpperCase(buildType);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  switch(target->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target->Target);
      break;
    case cmTarget::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
    case cmTarget::SHARED_LIBRARY:
      {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      if(this->Makefile->IsOn("WIN32") &&
         !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW")))
        {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        for(std::vector<cmSourceFile*>::const_iterator i = sources.begin();
            i != sources.end(); ++i)
          {
          cmSourceFile* sf = *i;
          if(sf->GetExtension() == "def")
            {
            linkFlags +=
              this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
            linkFlags += this->Convert(sf->GetFullPath(),
                                       FULL, SHELL);
            linkFlags += " ";
            }
          }
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      }
      break;
    case cmTarget::EXECUTABLE:
      {
      linkFlags +=
        this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      std::string linkLanguage = target->Target->GetLinkerLanguage(buildType);
      if(linkLanguage.empty())
        {
        cmSystemTools::Error
          ("CMake can not determine linker language for target: ",
           target->Target->GetName().c_str());
        return;
        }
      this->AddLanguageFlags(flags, linkLanguage, buildType);
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      if(cmSystemTools::IsOn
         (this->Makefile->GetDefinition("BUILD_SHARED_LIBS")))
        {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_")
          + linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
        }
      if ( target->GetPropertyAsBool("WIN32_EXECUTABLE") )
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
        }
      else
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
        }
      if (target->Target->IsExecutableWithExports())
        {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags +=
          this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      }
      break;
    default:
      break;
    }
}